

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O3

bool __thiscall
duckdb::ColumnDataCheckpointer::HasChanges(ColumnDataCheckpointer *this,ColumnData *col_data)

{
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var1;
  bool bVar2;
  const_reference pvVar3;
  idx_t start_row;
  size_type __n;
  SegmentLock l;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &(col_data->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if (*(pointer *)
       ((long)&(col_data->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
               super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               .
               super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
               ._M_impl.super__Vector_impl_data + 8) !=
      (col_data->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar3 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[]
                         (&(col_data->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes,
                          __n);
      _Var1._M_head_impl =
           (pvVar3->node).
           super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
           .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
      if ((_Var1._M_head_impl)->segment_type == TRANSIENT) {
        return true;
      }
      start_row = *(long *)&(_Var1._M_head_impl)->super_SegmentBase<duckdb::ColumnSegment> -
                  (this->row_group->super_SegmentBase<duckdb::RowGroup>).start;
      bVar2 = ColumnData::HasChanges
                        (col_data,start_row,
                         (__int_type)
                         ((atomic<unsigned_long> *)
                         ((long)&(_Var1._M_head_impl)->super_SegmentBase<duckdb::ColumnSegment> + 8)
                         )->super___atomic_base<unsigned_long> + start_row);
      if (bVar2) {
        return true;
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)*(pointer *)
                                  ((long)&(col_data->data).
                                          super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
                                          super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                                          .
                                          super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           (long)(col_data->data).super_SegmentTree<duckdb::ColumnSegment,_false>.
                                 nodes.
                                 super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                                 .
                                 super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  return false;
}

Assistant:

bool ColumnDataCheckpointer::HasChanges(ColumnData &col_data) {
	auto &nodes = col_data.data.ReferenceSegments();
	for (idx_t segment_idx = 0; segment_idx < nodes.size(); segment_idx++) {
		auto segment = nodes[segment_idx].node.get();
		if (segment->segment_type == ColumnSegmentType::TRANSIENT) {
			// transient segment: always need to write to disk
			return true;
		}
		// persistent segment; check if there were any updates or deletions in this segment
		idx_t start_row_idx = segment->start - row_group.start;
		idx_t end_row_idx = start_row_idx + segment->count;
		if (col_data.HasChanges(start_row_idx, end_row_idx)) {
			return true;
		}
	}
	return false;
}